

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O1

void __thiscall Camera::move_left(Camera *this,float delta_time)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = (this->right).field_1.y;
  fVar2 = (this->right).field_2.z;
  fVar3 = this->speed;
  (this->position).field_0.x =
       (this->position).field_0.x - (this->right).field_0.x * delta_time * fVar3;
  (this->position).field_1.y = (this->position).field_1.y - fVar1 * delta_time * fVar3;
  (this->position).field_2.z = (this->position).field_2.z - delta_time * fVar2 * fVar3;
  return;
}

Assistant:

void Camera::move_left(float delta_time) {
    position -= right * delta_time * speed;
}